

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_sah_builder.h
# Opt level: O1

optional<unsigned_long> __thiscall
bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::try_split
          (BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *this,BBox *bbox,size_t begin
          ,size_t end)

{
  long *plVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  pointer pBVar5;
  pointer pVVar6;
  unsigned_long uVar7;
  pointer puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  unsigned_long *puVar15;
  long lVar16;
  pointer puVar17;
  _Storage<unsigned_long,_true> _Var18;
  undefined8 extraout_RDX;
  unsigned_long *puVar19;
  undefined8 uVar20;
  undefined8 extraout_RDX_00;
  long lVar21;
  long lVar22;
  size_t sVar23;
  unsigned_long __tmp;
  ulong uVar24;
  size_t axis;
  Bins *bins;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM8 [64];
  optional<unsigned_long> oVar29;
  Split best_split;
  PerAxisBins per_axis_bins;
  undefined1 local_370 [8];
  float local_368;
  ulong local_360;
  undefined8 local_358;
  float local_350;
  Config *local_348;
  ulong local_340;
  ulong local_338;
  Bins local_330;
  uint local_230 [3];
  undefined8 uStack_224;
  uint uStack_21c;
  long alStack_218 [29];
  uint auStack_130 [3];
  undefined8 uStack_124;
  uint uStack_11c;
  long alStack_118 [29];
  
  lVar16 = 0;
  do {
    lVar22 = 0;
    do {
      lVar21 = 0;
      do {
        *(undefined4 *)(local_370 + lVar21) = 0x7f7fffff;
        lVar21 = lVar21 + 4;
      } while (lVar21 != 0xc);
      lVar21 = 0;
      do {
        *(undefined4 *)((long)&local_358 + lVar21) = 0xff7fffff;
        lVar21 = lVar21 + 4;
      } while (lVar21 != 0xc);
      *(float *)((long)local_330._M_elems[0].bbox.min.values + lVar22 + lVar16 + 8) = local_368;
      *(undefined1 (*) [8])((long)local_330._M_elems[0].bbox.min.values + lVar22 + lVar16) =
           local_370;
      *(undefined8 *)((long)local_330._M_elems[0].bbox.max.values + lVar22 + lVar16) = local_358;
      *(float *)((long)local_330._M_elems[0].bbox.max.values + lVar22 + lVar16 + 8) = local_350;
      *(undefined8 *)((long)(&local_330._M_elems[0].bbox + 1) + lVar22 + lVar16) = 0;
      lVar22 = lVar22 + 0x20;
    } while (lVar22 != 0x100);
    lVar16 = lVar16 + 0x100;
  } while (lVar16 != 0x300);
  lVar16 = 0;
  do {
    *(undefined4 *)(local_370 + lVar16) = 0x41000000;
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0xc);
  fVar2 = (bbox->min).values[0];
  fVar3 = (bbox->min).values[1];
  fVar25 = (bbox->max).values[0] - fVar2;
  fVar26 = (bbox->max).values[1] - fVar3;
  auVar9 = vinsertps_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar26),0x10);
  fVar4 = (bbox->min).values[2];
  fVar11 = (bbox->max).values[2] - fVar4;
  local_338 = end - begin;
  if (begin <= end && end - begin != 0) {
    fVar25 = (float)local_370._0_4_ / fVar25;
    fVar26 = (float)local_370._4_4_ / fVar26;
    auVar27._0_4_ = local_368 / fVar11;
    auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
    puVar17 = (this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pBVar5 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).bboxes_._M_ptr;
    pVVar6 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).centers_._M_ptr;
    auVar28._12_4_ = 0;
    auVar28._0_12_ = ZEXT812(0);
    auVar28 = auVar28 << 0x20;
    in_ZMM8 = ZEXT1264(ZEXT812(0)) << 0x20;
    sVar23 = begin;
    do {
      uVar7 = puVar17[sVar23];
      auVar12 = vfmadd132ss_fma(ZEXT416((uint)pVVar6[uVar7].values[0]),
                                ZEXT416((uint)(fVar25 * -fVar2)),ZEXT416((uint)fVar25));
      auVar12 = vmaxss_avx(auVar12,auVar28);
      uVar24 = vcvttss2usi_avx512f(auVar12);
      if (6 < uVar24) {
        uVar24 = 7;
      }
      auVar13 = vfmadd132ss_fma(ZEXT416((uint)pVVar6[uVar7].values[1]),
                                ZEXT416((uint)(fVar26 * -fVar3)),ZEXT416((uint)fVar26));
      auVar14 = vfmadd132ss_fma(ZEXT416((uint)pVVar6[uVar7].values[2]),
                                ZEXT416((uint)(auVar27._0_4_ * -fVar4)),auVar27);
      uVar24 = (ulong)(uint)((int)uVar24 << 5);
      auVar12 = vminss_avx(ZEXT416(*(uint *)((long)local_330._M_elems[0].bbox.min.values + uVar24)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[0]));
      auVar10 = vminss_avx(ZEXT416(*(uint *)((long)local_330._M_elems[0].bbox.min.values +
                                            uVar24 + 4)),ZEXT416((uint)pBVar5[uVar7].min.values[1]))
      ;
      auVar12 = vinsertps_avx(auVar12,auVar10,0x10);
      auVar10 = vminss_avx(ZEXT416(*(uint *)((long)local_330._M_elems[0].bbox.min.values +
                                            uVar24 + 8)),ZEXT416((uint)pBVar5[uVar7].min.values[2]))
      ;
      uVar20 = vmovlps_avx(auVar12);
      *(undefined8 *)((long)local_330._M_elems[0].bbox.min.values + uVar24) = uVar20;
      *(int *)((long)local_330._M_elems[0].bbox.min.values + uVar24 + 8) = auVar10._0_4_;
      auVar12 = vmaxss_avx(ZEXT416(*(uint *)((long)local_330._M_elems[0].bbox.max.values + uVar24)),
                           ZEXT416((uint)pBVar5[uVar7].max.values[0]));
      auVar10 = vmaxss_avx(ZEXT416(*(uint *)((long)local_330._M_elems[0].bbox.max.values +
                                            uVar24 + 4)),ZEXT416((uint)pBVar5[uVar7].max.values[1]))
      ;
      auVar12 = vinsertps_avx(auVar12,auVar10,0x10);
      auVar10 = vmaxss_avx(ZEXT416(*(uint *)((long)local_330._M_elems[0].bbox.max.values +
                                            uVar24 + 8)),ZEXT416((uint)pBVar5[uVar7].max.values[2]))
      ;
      uVar20 = vmovlps_avx(auVar12);
      *(undefined8 *)((long)local_330._M_elems[0].bbox.max.values + uVar24) = uVar20;
      *(int *)((long)local_330._M_elems[0].bbox.max.values + uVar24 + 8) = auVar10._0_4_;
      plVar1 = (long *)((long)(&local_330._M_elems[0].bbox + 1) + uVar24);
      *plVar1 = *plVar1 + 1;
      auVar12 = vmaxss_avx(auVar13,auVar28);
      uVar24 = vcvttss2usi_avx512f(auVar12);
      if (6 < uVar24) {
        uVar24 = 7;
      }
      uVar7 = puVar17[sVar23];
      uVar24 = (ulong)(uint)((int)uVar24 << 5);
      auVar12 = vminss_avx(ZEXT416(*(uint *)((long)local_230 + uVar24)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[0]));
      auVar10 = vminss_avx(ZEXT416(*(uint *)((long)local_230 + uVar24 + 4)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[1]));
      auVar12 = vinsertps_avx(auVar12,auVar10,0x10);
      auVar10 = vminss_avx(ZEXT416(*(uint *)((long)local_230 + uVar24 + 8)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[2]));
      uVar20 = vmovlps_avx(auVar12);
      *(undefined8 *)((long)local_230 + uVar24) = uVar20;
      *(int *)((long)local_230 + uVar24 + 8) = auVar10._0_4_;
      auVar12 = vmaxss_avx(ZEXT416(*(uint *)((long)&uStack_224 + uVar24)),
                           ZEXT416((uint)pBVar5[uVar7].max.values[0]));
      auVar10 = vmaxss_avx(ZEXT416(*(uint *)((long)&uStack_224 + uVar24 + 4)),
                           ZEXT416((uint)pBVar5[uVar7].max.values[1]));
      auVar12 = vinsertps_avx(auVar12,auVar10,0x10);
      auVar10 = vmaxss_avx(ZEXT416(*(uint *)((long)alStack_218 + (uVar24 - 4))),
                           ZEXT416((uint)pBVar5[uVar7].max.values[2]));
      uVar20 = vmovlps_avx(auVar12);
      *(undefined8 *)((long)&uStack_224 + uVar24) = uVar20;
      *(int *)((long)alStack_218 + (uVar24 - 4)) = auVar10._0_4_;
      *(long *)((long)alStack_218 + uVar24) = *(long *)((long)alStack_218 + uVar24) + 1;
      auVar12 = vmaxss_avx(auVar14,auVar28);
      uVar24 = vcvttss2usi_avx512f(auVar12);
      if (6 < uVar24) {
        uVar24 = 7;
      }
      uVar24 = (ulong)(uint)((int)uVar24 << 5);
      uVar7 = puVar17[sVar23];
      auVar12 = vminss_avx(ZEXT416(*(uint *)((long)auStack_130 + uVar24)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[0]));
      auVar10 = vminss_avx(ZEXT416(*(uint *)((long)auStack_130 + uVar24 + 4)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[1]));
      auVar12 = vinsertps_avx(auVar12,auVar10,0x10);
      auVar10 = vminss_avx(ZEXT416(*(uint *)((long)auStack_130 + uVar24 + 8)),
                           ZEXT416((uint)pBVar5[uVar7].min.values[2]));
      uVar20 = vmovlps_avx(auVar12);
      *(undefined8 *)((long)auStack_130 + uVar24) = uVar20;
      *(int *)((long)auStack_130 + uVar24 + 8) = auVar10._0_4_;
      auVar12 = vmaxss_avx(ZEXT416(*(uint *)((long)&uStack_124 + uVar24)),
                           ZEXT416((uint)pBVar5[uVar7].max.values[0]));
      auVar10 = vmaxss_avx(ZEXT416(*(uint *)((long)&uStack_124 + uVar24 + 4)),
                           ZEXT416((uint)pBVar5[uVar7].max.values[1]));
      auVar12 = vinsertps_avx(auVar12,auVar10,0x10);
      auVar10 = vmaxss_avx(ZEXT416(*(uint *)((long)alStack_118 + (uVar24 - 4))),
                           ZEXT416((uint)pBVar5[uVar7].max.values[2]));
      uVar20 = vmovlps_avx(auVar12);
      *(undefined8 *)((long)&uStack_124 + uVar24) = uVar20;
      *(int *)((long)alStack_118 + (uVar24 - 4)) = auVar10._0_4_;
      *(long *)((long)alStack_118 + uVar24) = *(long *)((long)alStack_118 + uVar24) + 1;
      sVar23 = sVar23 + 1;
    } while (end != sVar23);
  }
  local_348 = (Config *)begin;
  sVar23 = vmovlps_avx(auVar9);
  local_370 = (undefined1  [8])sVar23;
  local_370._4_4_ = (undefined4)(sVar23 >> 0x20);
  local_370._0_4_ = (undefined4)sVar23;
  local_360 = 2;
  if (fVar11 <= *(float *)(local_370 + (ulong)((float)local_370._0_4_ < (float)local_370._4_4_) * 4)
     ) {
    local_360 = (ulong)((float)local_370._0_4_ < (float)local_370._4_4_);
  }
  local_370 = (undefined1  [8])0x4;
  local_368 = 3.4028235e+38;
  bins = &local_330;
  sVar23 = 0;
  local_340 = local_360;
  do {
    find_best_split(this,sVar23,bins,(Split *)local_370);
    sVar23 = sVar23 + 1;
    bins = bins + 1;
  } while (sVar23 != 3);
  _Var18 = (_Storage<unsigned_long,_true>)
           (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  fVar2 = (bbox->max).values[0] - (bbox->min).values[0];
  fVar3 = (bbox->max).values[1] - (bbox->min).values[1];
  fVar4 = (bbox->max).values[2] - (bbox->min).values[2];
  puVar19 = (unsigned_long *)CONCAT71((int7)((ulong)extraout_RDX >> 8),*(byte *)_Var18);
  auVar9 = vcvtusi2ss_avx512f(in_ZMM8._0_16_,
                              *(size_t *)(_Var18._M_value + 8) + local_338 >>
                              ((ulong)*(byte *)_Var18 & 0x3f));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar3)),ZEXT416((uint)fVar4),
                            ZEXT416((uint)(fVar2 + fVar3)));
  if (auVar28._0_4_ * (auVar9._0_4_ - *(float *)(_Var18._M_value + 0x10)) <= local_368) {
    if (local_338 <= *(size_t *)(_Var18._M_value + 0x20)) {
      uVar20 = 0;
      goto LAB_0010b794;
    }
  }
  else {
    auVar9 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3),0x10);
    local_358 = vmovlps_avx(auVar9);
    local_350 = fVar4;
    puVar8 = (this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar17 = puVar8 + (long)local_348;
    if ((Config *)end != local_348) {
      auVar9 = vcvtusi2ss_avx512f(in_ZMM8._0_16_,local_370);
      auVar9 = vfmadd213ss_fma(auVar9,ZEXT416((uint)(*(float *)((long)&local_358 + local_360 * 4) *
                                                    0.125)),
                               ZEXT416((uint)(bbox->min).values[local_360]));
      puVar19 = puVar8 + end;
      pVVar6 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).centers_.
               _M_ptr;
      puVar15 = puVar17;
      do {
        while( true ) {
          puVar17 = puVar15;
          uVar7 = *puVar17;
          if (auVar9._0_4_ <= pVVar6[uVar7].values[local_360]) break;
          puVar17 = puVar17 + 1;
          puVar15 = puVar17;
          if (puVar17 == puVar19) goto LAB_0010b6c3;
        }
        do {
          puVar19 = puVar19 + -1;
          if (puVar19 == puVar17) goto LAB_0010b6c3;
        } while (auVar9._0_4_ <= pVVar6[*puVar19].values[local_360]);
        *puVar17 = *puVar19;
        *puVar19 = uVar7;
        puVar15 = puVar17 + 1;
      } while (puVar19 != puVar17 + 1);
      puVar17 = puVar17 + 1;
    }
LAB_0010b6c3:
    _Var18._M_value = (long)puVar17 - (long)puVar8 >> 3;
    uVar20 = CONCAT71((int7)((ulong)puVar19 >> 8),1);
    if ((Config *)_Var18._M_value != local_348 && _Var18._M_value != end) goto LAB_0010b794;
  }
  _Var18._M_value = fallback_split(this,local_340,(size_t)local_348,end);
  uVar20 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
LAB_0010b794:
  oVar29.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar20;
  oVar29.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var18._M_value;
  return (optional<unsigned_long>)
         oVar29.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        PerAxisBins per_axis_bins;
        fill_bins(per_axis_bins, bbox, begin, end);

        auto largest_axis = bbox.get_diagonal().get_largest_axis();
        auto best_split = Split { BinCount / 2, std::numeric_limits<Scalar>::max(), largest_axis };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, per_axis_bins[axis], best_split);

        // Make sure that the split is good before proceeding with it
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;
            return fallback_split(largest_axis, begin, end);
        }

        auto split_pos = fast_mul_add(
            bbox.get_diagonal()[best_split.axis] / static_cast<Scalar>(BinCount),
            static_cast<Scalar>(best_split.bin_id),
            bbox.min[best_split.axis]);

        size_t index = std::partition(prim_ids_.begin() + begin, prim_ids_.begin() + end,
            [&] (size_t i) { return centers_[i][best_split.axis] < split_pos; }) - prim_ids_.begin();
        if (index == begin || index == end)
            return fallback_split(largest_axis, begin, end);

        return std::make_optional(index);
    }